

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msdfgen.cpp
# Opt level: O3

void msdfgen::generatePseudoSDF
               (Bitmap<float> *output,Shape *shape,double range,Vector2 *scale,Vector2 *translate)

{
  double dVar1;
  SignedDistance b;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  EdgeSegment *pEVar6;
  float *pfVar7;
  ulong uVar8;
  EdgeHolder *this;
  pointer this_00;
  uint uVar9;
  pointer pCVar10;
  uint uVar11;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  undefined8 uVar18;
  Vector2 VVar19;
  SignedDistance a;
  vector<int,_std::allocator<int>_> windings;
  vector<double,_std::allocator<double>_> contourSD;
  double param;
  SignedDistance local_130;
  int local_11c;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  undefined8 uStack_100;
  vector<int,_std::allocator<int>_> local_f8;
  double local_d8;
  uint local_d0;
  int local_cc;
  vector<double,_std::allocator<double>_> local_c8;
  ulong local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Shape *local_78;
  double local_70;
  Bitmap<float> *local_68;
  Vector2 *local_60;
  Vector2 *local_58;
  ulong local_50;
  double local_48;
  Vector2 local_40;
  
  uVar11 = (int)((long)(shape->contours).
                       super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(shape->contours).
                       super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_70 = range;
  local_60 = translate;
  local_58 = scale;
  local_11c = Bitmap<float>::width(output);
  local_68 = output;
  uVar4 = Bitmap<float>::height(output);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(&local_f8,(long)(int)uVar11);
  pCVar10 = (shape->contours).
            super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pCVar10 !=
      (shape->contours).super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      iVar5 = Contour::winding(pCVar10);
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,iVar5);
      if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_c8);
      }
      else {
        *local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar5;
        local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      pCVar10 = pCVar10 + 1;
    } while (pCVar10 !=
             (shape->contours).
             super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::resize(&local_c8,(long)(int)uVar11);
  if (0 < (int)uVar4) {
    uVar12 = (ulong)(uVar11 & 0x7fffffff);
    uVar8 = 0;
    local_b0 = uVar12;
    local_78 = shape;
    do {
      uVar9 = (uint)uVar8;
      local_d0 = ~uVar9 + uVar4;
      if (shape->inverseYAxis == false) {
        local_d0 = uVar9;
      }
      if (0 < local_11c) {
        local_48 = (double)(int)uVar9 + 0.5;
        local_50 = uVar8;
        iVar5 = 0;
        do {
          local_cc = iVar5;
          Vector2::Vector2(&local_40,(double)local_cc + 0.5,local_48);
          VVar19 = Vector2::operator/(&local_40,local_58);
          local_130.dot = VVar19.y;
          local_130.distance = VVar19.x;
          VVar19 = Vector2::operator-((Vector2 *)&local_130,local_60);
          local_a8 = VVar19.y;
          local_a0 = VVar19.x;
          uVar13 = 0xde7ad7e3;
          uVar14 = 0xf1c33234;
          uVar15 = 0;
          uVar16 = 0;
          local_108 = 1e+240;
          uStack_100 = 0x8000000000000000;
          local_118 = -1e+240;
          uStack_110 = 0;
          if ((int)uVar11 < 1) {
            iVar5 = 0;
          }
          else {
            pCVar10 = (shape->contours).
                      super__Vector_base<msdfgen::Contour,_std::allocator<msdfgen::Contour>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar8 = 0;
            local_88 = -1e+240;
            uStack_80 = 0;
            iVar5 = 0;
            do {
              SignedDistance::SignedDistance(&local_130);
              this_00 = *(pointer *)
                         &(pCVar10->edges).
                          super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
              ;
              if (this_00 ==
                  (pCVar10->edges).
                  super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
                local_d8 = 0.0;
                this = (EdgeHolder *)0x0;
              }
              else {
                local_d8 = 0.0;
                this = (EdgeHolder *)0x0;
                do {
                  pEVar6 = EdgeHolder::operator->(this_00);
                  dVar17 = local_a8;
                  (*pEVar6->_vptr_EdgeSegment[5])(SUB84(local_a0,0),pEVar6,&local_40);
                  b.dot = local_130.dot;
                  b.distance = local_130.distance;
                  local_90 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                  a.dot = dVar17;
                  a.distance = local_90;
                  local_98 = dVar17;
                  bVar3 = operator<(a,b);
                  if (bVar3) {
                    local_130.distance = local_90;
                    local_130.dot = local_98;
                    local_d8 = local_40.x;
                    this = this_00;
                  }
                  this_00 = this_00 + 1;
                } while (this_00 !=
                         (pCVar10->edges).
                         super__Vector_base<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              uVar13 = SUB84(local_130.distance,0);
              uVar14 = (undefined4)((ulong)local_130.distance >> 0x20);
              if (ABS(local_130.distance) < ABS(local_118)) {
                iVar5 = -local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar8];
                local_118 = local_130.distance;
                uStack_110 = 0;
              }
              if (this != (EdgeHolder *)0x0) {
                pEVar6 = EdgeHolder::operator->(this);
                (*pEVar6->_vptr_EdgeSegment[6])
                          (SUB84(local_a0,0),local_a8,local_d8,pEVar6,&local_130);
                uVar13 = SUB84(local_130.distance,0);
                uVar14 = (undefined4)((ulong)local_130.distance >> 0x20);
              }
              local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar8] = (double)CONCAT44(uVar14,uVar13);
              if ((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8] < 1) || (local_130.distance < 0.0)) {
                if ((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8] < 0) &&
                   ((local_130.distance <= 0.0 && (ABS(local_130.distance) < ABS(local_108))))) {
                  local_108 = local_130.distance;
                  uStack_100 = 0;
                }
              }
              else if (ABS(local_130.distance) < ABS(local_88)) {
                local_88 = local_130.distance;
                uStack_80 = 0;
              }
              uVar8 = uVar8 + 1;
              pCVar10 = pCVar10 + 1;
            } while (uVar8 != local_b0);
            shape = local_78;
            uVar12 = local_b0;
            uVar13 = (undefined4)local_88;
            uVar14 = local_88._4_4_;
            uVar15 = (undefined4)uStack_80;
            uVar16 = uStack_80._4_4_;
          }
          iVar2 = local_cc;
          uStack_110 = 0;
          local_118 = -1e+240;
          dVar17 = (double)CONCAT44(uVar14,uVar13);
          uVar18 = CONCAT44(uVar16,uVar15);
          if (((double)CONCAT44(uVar14,uVar13) < 0.0) || (ABS(local_108) < ABS(dVar17))) {
            if (local_108 <= 0.0) {
              if (ABS(local_108) <= ABS(dVar17)) {
                local_118 = local_108;
                uStack_110 = uStack_100;
                iVar5 = -1;
                if (0 < (int)uVar11) {
                  uVar8 = 0;
                  do {
                    if (((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8] < 0) &&
                        (dVar1 = local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar8], dVar1 < local_108)
                        ) && (ABS(dVar1) < ABS(dVar17))) {
                      uStack_100 = 0;
                      local_108 = dVar1;
                    }
                    uVar8 = uVar8 + 1;
                  } while (uVar12 != uVar8);
                  iVar5 = -1;
                  local_118 = local_108;
                  uStack_110 = uStack_100;
                }
              }
            }
LAB_00165937:
            if (0 < (int)uVar11) {
              uVar8 = 0;
              do {
                if ((local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8] != iVar5) &&
                   (ABS(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar8]) < ABS(local_118))) {
                  uStack_110 = 0;
                  local_118 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar8];
                }
                uVar8 = uVar8 + 1;
              } while (uVar12 != uVar8);
            }
          }
          else {
            local_118 = dVar17;
            uStack_110 = uVar18;
            if (0 < (int)uVar11) {
              uVar8 = 0;
              do {
                if (((0 < local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar8]) &&
                    (dVar1 = local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar8], dVar17 < dVar1)) &&
                   (ABS(dVar1) < ABS(local_108))) {
                  uVar18 = 0;
                  dVar17 = dVar1;
                }
                uVar8 = uVar8 + 1;
              } while (uVar12 != uVar8);
              iVar5 = 1;
              local_118 = dVar17;
              uStack_110 = uVar18;
              goto LAB_00165937;
            }
          }
          pfVar7 = Bitmap<float>::operator()(local_68,local_cc,local_d0);
          *pfVar7 = (float)(local_118 / local_70 + 0.5);
          uVar8 = local_50;
          iVar5 = iVar2 + 1;
        } while (iVar2 + 1 != local_11c);
      }
      uVar9 = (int)uVar8 + 1;
      uVar8 = (ulong)uVar9;
    } while (uVar9 != uVar4);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void generatePseudoSDF(Bitmap<float> &output, const Shape &shape, double range, const Vector2 &scale, const Vector2 &translate) {
    int contourCount = shape.contours.size();
    int w = output.width(), h = output.height();
    std::vector<int> windings;
    windings.reserve(contourCount);
    for (std::vector<Contour>::const_iterator contour = shape.contours.begin(); contour != shape.contours.end(); ++contour)
        windings.push_back(contour->winding());

#ifdef MSDFGEN_USE_OPENMP
    #pragma omp parallel
#endif
    {
        std::vector<double> contourSD;
        contourSD.resize(contourCount);
#ifdef MSDFGEN_USE_OPENMP
        #pragma omp for
#endif
        for (int y = 0; y < h; ++y) {
            int row = shape.inverseYAxis ? h-y-1 : y;
            for (int x = 0; x < w; ++x) {
                Point2 p = Vector2(x+.5, y+.5)/scale-translate;
                double sd = SignedDistance::INFINITE.distance;
                double negDist = -SignedDistance::INFINITE.distance;
                double posDist = SignedDistance::INFINITE.distance;
                int winding = 0;

                std::vector<Contour>::const_iterator contour = shape.contours.begin();
                for (int i = 0; i < contourCount; ++i, ++contour) {
                    SignedDistance minDistance;
                    const EdgeHolder *nearEdge = NULL;
                    double nearParam = 0;
                    for (std::vector<EdgeHolder>::const_iterator edge = contour->edges.begin(); edge != contour->edges.end(); ++edge) {
                        double param;
                        SignedDistance distance = (*edge)->signedDistance(p, param);
                        if (distance < minDistance) {
                            minDistance = distance;
                            nearEdge = &*edge;
                            nearParam = param;
                        }
                    }
                    if (fabs(minDistance.distance) < fabs(sd)) {
                        sd = minDistance.distance;
                        winding = -windings[i];
                    }
                    if (nearEdge)
                        (*nearEdge)->distanceToPseudoDistance(minDistance, p, nearParam);
                    contourSD[i] = minDistance.distance;
                    if (windings[i] > 0 && minDistance.distance >= 0 && fabs(minDistance.distance) < fabs(posDist))
                        posDist = minDistance.distance;
                    if (windings[i] < 0 && minDistance.distance <= 0 && fabs(minDistance.distance) < fabs(negDist))
                        negDist = minDistance.distance;
                }

                double psd = SignedDistance::INFINITE.distance;
                if (posDist >= 0 && fabs(posDist) <= fabs(negDist)) {
                    psd = posDist;
                    winding = 1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] > 0 && contourSD[i] > psd && fabs(contourSD[i]) < fabs(negDist))
                            psd = contourSD[i];
                } else if (negDist <= 0 && fabs(negDist) <= fabs(posDist)) {
                    psd = negDist;
                    winding = -1;
                    for (int i = 0; i < contourCount; ++i)
                        if (windings[i] < 0 && contourSD[i] < psd && fabs(contourSD[i]) < fabs(posDist))
                            psd = contourSD[i];
                }
                for (int i = 0; i < contourCount; ++i)
                    if (windings[i] != winding && fabs(contourSD[i]) < fabs(psd))
                        psd = contourSD[i];

                output(x, row) = float(psd/range+.5);
            }
        }
    }
}